

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O3

void Omega_h::print_set(set<int,_std::less<int>,_std::allocator<int>_> *set,Grammar *grammar)

{
  _Rb_tree_color _Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  undefined8 uVar4;
  size_type sVar5;
  pointer pbVar6;
  char *pcVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"{",1);
  p_Var3 = (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(set->_M_t)._M_impl.super__Rb_tree_header) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"}",1);
      return;
    }
    if (p_Var3 != (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
    }
    _Var1 = p_Var3[1]._M_color;
    if ((ulong)_Var1 == 0xfffffe57) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"null",4);
    }
    else {
      if ((int)_Var1 < 0) {
        pcVar7 = "0 <= i";
        uVar4 = 0x1d;
LAB_00241ddc:
        fail("assertion %s failed at %s +%d\n",pcVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,uVar4);
      }
      pbVar6 = (grammar->symbol_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(grammar->symbol_names).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) >> 5) <=
          (int)_Var1) {
        pcVar7 = "i < int(v.size())";
        uVar4 = 0x1e;
        goto LAB_00241ddc;
      }
      pbVar6 = pbVar6 + _Var1;
      iVar2 = std::__cxx11::string::compare((char *)pbVar6);
      if (iVar2 == 0) {
        sVar5 = 3;
        pcVar7 = "\',\'";
      }
      else {
        pcVar7 = (pbVar6->_M_dataplus)._M_p;
        sVar5 = pbVar6->_M_string_length;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar5);
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

static void print_set(std::set<int> const& set, Grammar const& grammar) {
  std::cerr << "{";
  for (auto it = set.begin(); it != set.end(); ++it) {
    if (it != set.begin()) std::cerr << ", ";
    auto symb = *it;
    if (symb == FIRST_NULL)
      std::cerr << "null";
    else {
      auto& symb_name = at(grammar.symbol_names, symb);
      if (symb_name == ",")
        std::cerr << "','";
      else
        std::cerr << symb_name;
    }
  }
  std::cerr << "}";
}